

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.cpp
# Opt level: O1

size_t __thiscall StackBackTrace::Print(StackBackTrace *this)

{
  void *__ptr;
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  
  __ptr = (void *)backtrace_symbols(this + 1,this->framesCount);
  if (__ptr == (void *)0x0) {
    lVar2 = 0;
  }
  else {
    if (this->framesCount == 0) {
      lVar2 = 0;
    }
    else {
      uVar3 = 0;
      lVar2 = 0;
      do {
        sVar1 = Output::Print(L" %S\n",*(undefined8 *)((long)__ptr + uVar3 * 8));
        lVar2 = lVar2 + sVar1;
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->framesCount);
    }
    free(__ptr);
  }
  sVar1 = Output::Print(L"\n");
  return sVar1 + lVar2;
}

Assistant:

size_t
StackBackTrace::Print()
{
    size_t retValue = 0;

#ifdef DBGHELP_SYMBOL_MANAGER
    DbgHelpSymbolManager::EnsureInitialized();

    for(ULONG i = 0; i < this->framesCount; i++)
    {
        PVOID address = this->stackBackTrace[i];
        retValue += Output::Print(_u(" "));
        retValue += DbgHelpSymbolManager::PrintSymbol(address);
        retValue += Output::Print(_u("\n"));
    }
#else
    char** f = backtrace_symbols(this->stackBackTrace, this->framesCount);
    if (f)
    {
        for (ULONG i = 0; i < this->framesCount; i++)
        {
            retValue += Output::Print(_u(" %S\n"), f[i]);
        }
        free(f);
    }
#endif

    retValue += Output::Print(_u("\n"));
    return retValue;
}